

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

bool __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,true>>
::compare_keys<std::__cxx11::string,std::__cxx11::string>
          (btree<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,true>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *y)

{
  weak_ordering wVar1;
  string_view local_20;
  string_view local_10;
  
  local_10._M_str = (x->_M_dataplus)._M_p;
  local_10._M_len = x->_M_string_length;
  local_20._M_str = (y->_M_dataplus)._M_p;
  local_20._M_len = y->_M_string_length;
  wVar1 = StringBtreeDefaultLess::operator()((StringBtreeDefaultLess *)this,&local_10,&local_20);
  return (bool)((byte)wVar1.value_ >> 7);
}

Assistant:

bool compare_keys(const K &x, const LK &y) const {
            return compare_internal::compare_result_as_less_than(key_comp()(x, y));
        }